

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1957ff::ReverbState::earlyFaded
          (ReverbState *this,size_t offset,size_t todo,float fade,float fadeStep)

{
  float xCoeff;
  float yCoeff;
  float fVar1;
  float fVar2;
  ulong uVar3;
  float *pfVar4;
  anon_unknown_dwarf_1957ff *this_00;
  float *pfVar5;
  anon_unknown_dwarf_1957ff *paVar6;
  ulong uVar7;
  anon_union_4096_2_95c9c352_for_ReverbState_18 *paVar8;
  array<std::array<float,_256UL>,_4UL> *paVar9;
  long lVar10;
  size_t sVar11;
  float *pfVar12;
  float *pfVar13;
  anon_unknown_dwarf_1957ff *in_R9;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  DelayLineI delay;
  long local_70;
  
  uVar3 = (this->mEarly).Delay.Mask;
  pfVar4 = ((this->mEarly).Delay.field_1.Line)->_M_elems;
  this_00 = (anon_unknown_dwarf_1957ff *)(this->mDelay).Mask;
  pfVar5 = ((this->mDelay).field_1.Line)->_M_elems;
  xCoeff = this->mMixX;
  yCoeff = this->mMixY;
  paVar8 = &this->field_15;
  lVar10 = 0;
  pfVar12 = pfVar5;
  do {
    if (todo != 0) {
      fVar1 = this->mEarlyDelayCoeff[lVar10][0];
      fVar2 = this->mEarlyDelayCoeff[lVar10][1];
      paVar6 = (anon_unknown_dwarf_1957ff *)(offset - this->mEarlyDelayTap[lVar10][1]);
      in_R9 = (anon_unknown_dwarf_1957ff *)(offset - this->mEarlyDelayTap[lVar10][0]);
      uVar15 = 0;
      fVar20 = fade;
      do {
        uVar14 = (ulong)in_R9 & (ulong)this_00;
        uVar7 = (ulong)paVar6 & (ulong)this_00;
        uVar16 = uVar7;
        if (uVar7 < uVar14) {
          uVar16 = uVar14;
        }
        paVar6 = (anon_unknown_dwarf_1957ff *)(todo - uVar15);
        if (this_00 + (1 - uVar16) < (anon_unknown_dwarf_1957ff *)(todo - uVar15)) {
          paVar6 = this_00 + (1 - uVar16);
        }
        in_R9 = (anon_unknown_dwarf_1957ff *)0x0;
        pfVar13 = pfVar12;
        do {
          fVar20 = fVar20 + 1.0;
          *(float *)((long)paVar8 + (long)in_R9 * 4 + uVar15 * 4) =
               (-fVar1 * fadeStep * fVar20 + fVar1) * pfVar13[uVar14 * 4] +
               fVar2 * fadeStep * fVar20 * pfVar13[uVar7 * 4];
          in_R9 = in_R9 + 1;
          pfVar13 = pfVar13 + 4;
        } while (paVar6 != in_R9);
        uVar15 = uVar15 + (long)in_R9;
        paVar6 = in_R9 + uVar7;
        in_R9 = in_R9 + uVar14;
      } while (uVar15 < todo);
    }
    lVar10 = lVar10 + 1;
    paVar8 = (anon_union_4096_2_95c9c352_for_ReverbState_18 *)((long)paVar8 + 0x400);
    pfVar12 = pfVar12 + 1;
  } while (lVar10 != 4);
  paVar8 = &this->field_15;
  VecAllpass::processFaded
            (&(this->mEarly).VecAp,(span<std::array<float,_256UL>,_4UL>)paVar8,offset,xCoeff,yCoeff,
             fade,fadeStep,todo);
  paVar9 = &this->mEarlySamples;
  local_70 = 0;
  pfVar12 = pfVar4;
  do {
    if (todo != 0) {
      fVar1 = (this->mEarly).Coeff[local_70][0];
      fVar2 = (this->mEarly).Coeff[local_70][1];
      uVar7 = offset - (this->mEarly).Offset[local_70][1];
      uVar15 = offset - (this->mEarly).Offset[local_70][0];
      uVar16 = 0;
      fVar20 = fade;
      do {
        uVar15 = uVar15 & uVar3;
        uVar7 = uVar7 & uVar3;
        uVar14 = uVar7;
        if (uVar7 < uVar15) {
          uVar14 = uVar15;
        }
        uVar14 = (uVar3 + 1) - uVar14;
        uVar17 = todo - uVar16;
        if (uVar14 < todo - uVar16) {
          uVar17 = uVar14;
        }
        in_R9 = (anon_unknown_dwarf_1957ff *)(uVar15 * 0x10);
        uVar14 = 0;
        pfVar13 = pfVar12;
        do {
          fVar20 = fVar20 + 1.0;
          paVar9->_M_elems[0]._M_elems[uVar16 + uVar14] =
               fVar2 * fadeStep * fVar20 * pfVar13[uVar7 * 4] +
               (-fVar1 * fadeStep * fVar20 + fVar1) * pfVar13[uVar15 * 4] +
               *(float *)((long)(paVar9 + -1) + uVar14 * 4 + uVar16 * 4);
          pfVar13 = pfVar13 + 4;
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
        uVar16 = uVar16 + uVar14;
        uVar7 = uVar7 + uVar14;
        uVar15 = uVar15 + uVar14;
      } while (uVar16 < todo);
    }
    local_70 = local_70 + 1;
    pfVar12 = pfVar12 + 1;
    paVar9 = (array<std::array<float,_256UL>,_4UL> *)(paVar9->_M_elems + 1);
  } while (local_70 != 4);
  lVar19 = (long)(pfVar4 + 3);
  lVar10 = 0;
  do {
    if (todo != 0) {
      uVar15 = 0;
      sVar11 = offset;
      do {
        uVar7 = sVar11 & uVar3;
        uVar14 = (uVar3 + 1) - uVar7;
        uVar16 = todo - uVar15;
        if (uVar14 < todo - uVar15) {
          uVar16 = uVar14;
        }
        in_R9 = (anon_unknown_dwarf_1957ff *)0x0;
        lVar18 = 0;
        do {
          *(undefined4 *)(uVar7 * 0x10 + lVar19 + lVar18 * 4) =
               *(undefined4 *)((long)paVar8 + lVar18 + uVar15 * 4);
          lVar18 = lVar18 + 4;
          in_R9 = in_R9 + -1;
        } while (-(long)in_R9 != uVar16);
        uVar15 = uVar15 - (long)in_R9;
        sVar11 = uVar7 - (long)in_R9;
      } while (uVar15 < todo);
    }
    lVar10 = lVar10 + 1;
    lVar19 = lVar19 + -4;
    paVar8 = (anon_union_4096_2_95c9c352_for_ReverbState_18 *)((long)paVar8 + 0x400);
  } while (lVar10 != 4);
  delay.field_1.Line = (array<float,_4UL> *)(offset - this->mLateFeedTap);
  delay.Mask = (size_t)pfVar5;
  VectorScatterRevDelayIn
            (this_00,delay,(size_t)&this->mEarlySamples,xCoeff,yCoeff,
             (span<const_std::array<float,_256UL>,_4UL>)todo,(size_t)in_R9);
  return;
}

Assistant:

void ReverbState::earlyFaded(const size_t offset, const size_t todo, const float fade,
    const float fadeStep)
{
    const DelayLineI early_delay{mEarly.Delay};
    const DelayLineI main_delay{mDelay};
    const float mixX{mMixX};
    const float mixY{mMixY};

    ASSUME(todo > 0);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t early_delay_tap0{offset - mEarlyDelayTap[j][0]};
        size_t early_delay_tap1{offset - mEarlyDelayTap[j][1]};
        const float oldCoeff{mEarlyDelayCoeff[j][0]};
        const float oldCoeffStep{-oldCoeff * fadeStep};
        const float newCoeffStep{mEarlyDelayCoeff[j][1] * fadeStep};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            early_delay_tap0 &= main_delay.Mask;
            early_delay_tap1 &= main_delay.Mask;
            size_t td{minz(main_delay.Mask+1 - maxz(early_delay_tap0, early_delay_tap1), todo-i)};
            do {
                fadeCount += 1.0f;
                const float fade0{oldCoeff + oldCoeffStep*fadeCount};
                const float fade1{newCoeffStep*fadeCount};
                mTempSamples[j][i++] =
                    main_delay.Line[early_delay_tap0++][j]*fade0 +
                    main_delay.Line[early_delay_tap1++][j]*fade1;
            } while(--td);
        }
    }

    mEarly.VecAp.processFaded(mTempSamples, offset, mixX, mixY, fade, fadeStep, todo);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t feedb_tap0{offset - mEarly.Offset[j][0]};
        size_t feedb_tap1{offset - mEarly.Offset[j][1]};
        const float feedb_oldCoeff{mEarly.Coeff[j][0]};
        const float feedb_oldCoeffStep{-feedb_oldCoeff * fadeStep};
        const float feedb_newCoeffStep{mEarly.Coeff[j][1] * fadeStep};
        float *out{mEarlySamples[j].data()};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            feedb_tap0 &= early_delay.Mask;
            feedb_tap1 &= early_delay.Mask;
            size_t td{minz(early_delay.Mask+1 - maxz(feedb_tap0, feedb_tap1), todo - i)};

            do {
                fadeCount += 1.0f;
                const float fade0{feedb_oldCoeff + feedb_oldCoeffStep*fadeCount};
                const float fade1{feedb_newCoeffStep*fadeCount};
                out[i] = mTempSamples[j][i] +
                    early_delay.Line[feedb_tap0++][j]*fade0 +
                    early_delay.Line[feedb_tap1++][j]*fade1;
                ++i;
            } while(--td);
        }
    }
    for(size_t j{0u};j < NUM_LINES;j++)
        early_delay.write(offset, NUM_LINES-1-j, mTempSamples[j].data(), todo);

    const size_t late_feed_tap{offset - mLateFeedTap};
    VectorScatterRevDelayIn(main_delay, late_feed_tap, mixX, mixY, mEarlySamples, todo);
}